

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O0

void glcts::TessellationShadersIsolines::checkFirstOuterTessellationLevelEffect
               (_test_result *test_result,GLenum glMaxTessGenLevelToken)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this;
  MessageBuilder *pMVar3;
  TestError *this_00;
  MessageBuilder local_1c0;
  TestContext *local_40;
  TestContext *test;
  uint local_30;
  float outer_zero_tess_level_clamped_rounded;
  uint n_isolines_expected;
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  Context *context;
  _test_result *p_Stack_10;
  GLenum glMaxTessGenLevelToken_local;
  _test_result *test_result_local;
  
  context._4_4_ = glMaxTessGenLevelToken;
  p_Stack_10 = test_result;
  gl = (Functions *)getContext(test_result->parent->parent);
  pRVar2 = deqp::Context::getRenderContext((Context *)gl);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _n_isolines_expected = CONCAT44(extraout_var,iVar1);
  outer_zero_tess_level_clamped_rounded = 0.0;
  local_30 = 0;
  if (p_Stack_10->n_vertices != 0) {
    (**(code **)(_n_isolines_expected + 0x868))
              (context._4_4_,&outer_zero_tess_level_clamped_rounded);
    err = (**(code **)(_n_isolines_expected + 0x800))();
    glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x50);
    test._4_4_ = 0.0;
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,p_Stack_10->parent->outer_tess_levels[0],
               (GLint)outer_zero_tess_level_clamped_rounded,(float *)0x0,(float *)((long)&test + 4))
    ;
    local_30 = (uint)(long)test._4_4_;
    if (p_Stack_10->n_isolines != local_30) {
      local_40 = tcu::TestNode::getTestContext((TestNode *)p_Stack_10->parent->parent);
      this = tcu::TestContext::getLog(local_40);
      tcu::TestLog::operator<<(&local_1c0,this,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_1c0,
                          (char (*) [53])"Tessellator generated an invalid amount of isolines:");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&p_Stack_10->n_isolines);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [33])" instead of the expected amount:");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_30);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [59])
                                 " for the following inner tessellation level configuration:");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b0b32e);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,p_Stack_10->parent->inner_tess_levels);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,p_Stack_10->parent->inner_tess_levels + 1);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2a94734);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [58])
                                 " and the following outer tesellation level configuration:");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b0b32e);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,p_Stack_10->parent->outer_tess_levels);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,p_Stack_10->parent->outer_tess_levels + 1);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,p_Stack_10->parent->outer_tess_levels + 2);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,p_Stack_10->parent->outer_tess_levels + 3);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid amount of isolines generated by tessellator",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                 ,0x6e);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return;
}

Assistant:

void TessellationShadersIsolines::checkFirstOuterTessellationLevelEffect(_test_result&	 test_result,
																		 const glw::GLenum glMaxTessGenLevelToken)
{
	glcts::Context&		  context					  = test_result.parent->parent->getContext();
	const glw::Functions& gl						  = context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;
	unsigned int		  n_isolines_expected		  = 0;

	if (test_result.n_vertices != 0)
	{
		/* Calculate how many isolines we're expecting */
		gl.getIntegerv(glMaxTessGenLevelToken, &gl_max_tess_gen_level_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

		/* NOTE: Amount of isolines should always be based on TESSELLATION_SHADER_VERTEX_SPACING_EQUAL
		 *       vertex spacing mode, even if a different one is defined in TE stage.
		 */
		float outer_zero_tess_level_clamped_rounded = 0.0f;

		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, test_result.parent->outer_tess_levels[0],
			gl_max_tess_gen_level_value, DE_NULL, /* out_clamped */
			&outer_zero_tess_level_clamped_rounded);

		n_isolines_expected = (unsigned int)outer_zero_tess_level_clamped_rounded;

		if (test_result.n_isolines != n_isolines_expected)
		{
			tcu::TestContext& test = test_result.parent->parent->getTestContext();

			test.getLog() << tcu::TestLog::Message
						  << "Tessellator generated an invalid amount of isolines:" << test_result.n_isolines
						  << " instead of the expected amount:" << n_isolines_expected
						  << " for the following inner tessellation level configuration:"
						  << " (" << test_result.parent->inner_tess_levels[0] << ", "
						  << test_result.parent->inner_tess_levels[1] << ")"
						  << " and the following outer tesellation level configuration:"
						  << " (" << test_result.parent->outer_tess_levels[0] << ", "
						  << test_result.parent->outer_tess_levels[1] << ", "
						  << test_result.parent->outer_tess_levels[2] << ", "
						  << test_result.parent->outer_tess_levels[3] << ")" << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid amount of isolines generated by tessellator");
		}
	} /* if (test_run.n_vertices != 0) */
}